

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O1

void CreateBackwardReferencesDH65
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  Hasher *pHVar1;
  uint8_t *puVar2;
  long *plVar3;
  uint *puVar4;
  long lVar5;
  Hasher *pHVar6;
  ushort uVar7;
  int iVar8;
  uint uVar9;
  undefined4 uVar10;
  size_t sVar11;
  size_t sVar12;
  uint32_t *puVar13;
  uint32_t *puVar14;
  BrotliEncoderDictionary *pBVar15;
  Hasher *pHVar16;
  void *pvVar17;
  void *pvVar18;
  uint64_t uVar19;
  HasherCommon *pHVar20;
  BrotliDictionary *pBVar21;
  size_t sVar22;
  PreparedDictionary *pPVar23;
  ulong uVar24;
  undefined8 uVar25;
  ulong uVar26;
  byte bVar27;
  uint32_t uVar28;
  Hasher *pHVar29;
  Hasher *pHVar30;
  uint8_t *puVar31;
  byte bVar32;
  uint uVar33;
  int iVar34;
  long lVar35;
  Hasher *pHVar36;
  ulong uVar37;
  ulong uVar38;
  ulong *puVar39;
  ulong uVar40;
  ulong *puVar41;
  uint32_t *puVar42;
  Hasher *pHVar43;
  uint8_t *puVar44;
  undefined1 *puVar45;
  ulong uVar46;
  long lVar47;
  char *pcVar48;
  uint uVar49;
  int iVar50;
  long lVar51;
  Hasher *pHVar52;
  long lVar53;
  ulong *puVar54;
  Hasher *pHVar55;
  Hasher *pHVar56;
  size_t sVar57;
  uint32_t *puVar58;
  uint16_t uVar59;
  uint uVar60;
  long lVar61;
  ulong *puVar62;
  ulong *puVar63;
  byte bVar64;
  Hasher *pHVar65;
  Hasher *pHVar66;
  uint8_t *puVar67;
  Hasher *pHVar68;
  ulong uVar69;
  undefined1 *puVar70;
  uint uVar71;
  uint8_t *s1_orig_2;
  size_t sVar72;
  uint8_t *puVar73;
  Hasher *unaff_R14;
  Hasher *pHVar74;
  Hasher *pHVar75;
  ulong uVar76;
  long lVar77;
  bool bVar78;
  uint32_t *buckets;
  Hasher *local_190;
  ulong local_188;
  Hasher *local_170;
  Hasher *local_168;
  ulong local_160;
  int local_14c;
  Hasher *local_148;
  Hasher *local_130;
  Hasher *local_128;
  Hasher *local_110;
  Hasher *local_100;
  Command *local_e8;
  uint local_d4;
  uint8_t *s1_orig_1;
  ulong local_58;
  
  iVar50 = params->lgwin;
  sVar11 = params->stream_offset;
  local_100 = (Hasher *)*last_insert_len;
  pHVar29 = (Hasher *)((position - 7) + num_bytes);
  if (num_bytes < 8) {
    pHVar29 = (Hasher *)position;
  }
  lVar35 = 0x200;
  if (params->quality < 9) {
    lVar35 = 0x40;
  }
  puVar2 = (uint8_t *)(position + num_bytes);
  sVar12 = (params->dictionary).compound.total_size;
  iVar34 = (hasher->privat)._H6.num_last_distances_to_check_;
  if (4 < iVar34) {
    iVar8 = *dist_cache;
    dist_cache[4] = iVar8 + -1;
    dist_cache[5] = iVar8 + 1;
    dist_cache[6] = iVar8 + -2;
    dist_cache[7] = iVar8 + 2;
    *(ulong *)(dist_cache + 8) = CONCAT44(iVar8 + 3,iVar8 + -3);
    if (10 < iVar34) {
      iVar34 = dist_cache[1];
      dist_cache[10] = iVar34 + -1;
      dist_cache[0xb] = iVar34 + 1;
      dist_cache[0xc] = iVar34 + -2;
      dist_cache[0xd] = iVar34 + 2;
      *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar34 + 3,iVar34 + -3);
    }
  }
  if ((uint8_t *)(position + 8) < puVar2) {
    pHVar6 = (Hasher *)((1L << ((byte)iVar50 & 0x3f)) - 0x10);
    pHVar68 = (Hasher *)(lVar35 + position);
    puVar13 = (hasher->privat)._H5.buckets_;
    puVar14 = (hasher->privat)._H6.buckets_;
    lVar51 = sVar12 + 1;
    pHVar1 = (Hasher *)(puVar2 + -7);
    lVar5 = position - 1;
    local_e8 = commands;
    local_168 = (Hasher *)position;
    do {
      pHVar43 = pHVar6;
      if (local_168 < pHVar6) {
        pHVar43 = local_168;
      }
      pHVar36 = (Hasher *)((long)(local_168->common).extra + sVar11);
      if (pHVar6 <= pHVar36) {
        pHVar36 = pHVar6;
      }
      if ((params->dictionary).contextual.context_based == 0) {
        uVar37 = 0;
        local_58 = 0;
      }
      else {
        if (local_168 == (Hasher *)0x0) {
          local_58 = 0;
        }
        else {
          local_58 = (ulong)ringbuffer
                            [(ulong)((long)&local_168[-1].privat + 0x41fU) & ringbuffer_mask];
        }
        if (local_168 < (Hasher *)0x2) {
          uVar37 = 0;
        }
        else {
          uVar37 = (ulong)ringbuffer
                          [(ulong)((long)&local_168[-1].privat + 0x41eU) & ringbuffer_mask];
        }
        uVar37 = (ulong)(params->dictionary).contextual.context_map
                        [literal_context_lut[uVar37 + 0x100] | literal_context_lut[local_58]];
      }
      pHVar55 = (Hasher *)(puVar2 + -(long)local_168);
      local_d4 = (uint)uVar37;
      pBVar15 = (params->dictionary).contextual.dict[uVar37];
      pHVar16 = (Hasher *)(params->dist).max_distance;
      uVar37 = (ulong)local_168 & ringbuffer_mask;
      uVar69 = (ulong)(hasher->privat)._H6.num_last_distances_to_check_;
      if (uVar69 == 0) {
        local_160 = 0x7e4;
        local_170 = (Hasher *)0x0;
        local_148 = (Hasher *)0x0;
        pHVar75 = (Hasher *)0x0;
      }
      else {
        unaff_R14 = (Hasher *)(ringbuffer + uVar37);
        local_160 = 0x7e4;
        pHVar75 = (Hasher *)0x0;
        uVar76 = 0;
        local_148 = (Hasher *)0x0;
        local_170 = (Hasher *)0x0;
        do {
          pHVar30 = (Hasher *)(long)dist_cache[uVar76];
          if (((pHVar30 <= pHVar43) && ((Hasher *)((long)local_168 - (long)pHVar30) < local_168)) &&
             (puVar73 = (uint8_t *)((long)(pHVar75->common).extra + uVar37),
             puVar73 <= ringbuffer_mask)) {
            uVar38 = (ulong)((long)local_168 - (long)pHVar30) & ringbuffer_mask;
            puVar67 = (uint8_t *)((long)(pHVar75->common).extra + uVar38);
            if ((puVar67 <= ringbuffer_mask) &&
               (pHVar65 = (Hasher *)CONCAT71((int7)((ulong)puVar73 >> 8),ringbuffer[(long)puVar73]),
               ringbuffer[(long)puVar73] == ringbuffer[(long)puVar67])) {
              puVar39 = (ulong *)(ringbuffer + uVar38);
              pHVar66 = unaff_R14;
              puVar41 = puVar39;
              for (pHVar56 = pHVar55; (Hasher *)0x7 < pHVar56;
                  pHVar56 = (Hasher *)((long)&pHVar56[-1].privat + 0x418)) {
                pvVar17 = (pHVar66->common).extra[0];
                pvVar18 = (void *)*puVar41;
                if (pvVar17 == pvVar18) {
                  puVar41 = puVar41 + 1;
                }
                else {
                  uVar38 = 0;
                  if (((ulong)pvVar18 ^ (ulong)pvVar17) != 0) {
                    for (; (((ulong)pvVar18 ^ (ulong)pvVar17) >> uVar38 & 1) == 0;
                        uVar38 = uVar38 + 1) {
                    }
                  }
                  pHVar65 = (Hasher *)((long)puVar41 + ((uVar38 >> 3 & 0x1fffffff) - (long)puVar39))
                  ;
                }
                if (pvVar17 != pvVar18) goto LAB_0030c9bd;
                pHVar66 = (Hasher *)((pHVar66->common).extra + 1);
              }
              puVar62 = puVar41;
              if (pHVar56 != (Hasher *)0x0) {
                puVar62 = (ulong *)((long)puVar41 + (long)pHVar56);
                pHVar65 = (Hasher *)0x0;
                do {
                  if (*(uint8_t *)((long)puVar41 + (long)pHVar65) !=
                      *(uint8_t *)((long)(pHVar66->common).extra + (long)(pHVar65->common).extra)) {
                    puVar62 = (ulong *)((long)puVar41 + (long)pHVar65);
                    break;
                  }
                  pHVar65 = (Hasher *)((long)(pHVar65->common).extra + 1);
                } while (pHVar56 != pHVar65);
              }
              pHVar65 = (Hasher *)((long)puVar62 - (long)puVar39);
LAB_0030c9bd:
              if ((((Hasher *)0x2 < pHVar65) || ((uVar76 < 2 && (pHVar65 == (Hasher *)0x2)))) &&
                 (uVar38 = (long)pHVar65 * 0x87 + 0x78f, local_160 < uVar38)) {
                if (uVar76 != 0) {
                  uVar38 = uVar38 - ((0x1ca10U >> ((byte)uVar76 & 0xe) & 0xe) + 0x27);
                }
                if (local_160 < uVar38) {
                  pHVar75 = pHVar65;
                  local_148 = pHVar65;
                  local_170 = pHVar30;
                  local_160 = uVar38;
                }
              }
            }
          }
          uVar76 = uVar76 + 1;
        } while (uVar76 != uVar69);
      }
      uVar19 = (hasher->privat)._H6.hash_mul_;
      plVar3 = (long *)(ringbuffer + uVar37);
      pHVar65 = (Hasher *)(*plVar3 * uVar19 >> 0x31);
      lVar61 = (long)pHVar65 << (*(byte *)((long)&hasher->privat + 0x1c) & 0x3f);
      pHVar30 = (Hasher *)(ringbuffer + uVar37);
      uVar69 = (hasher->privat)._H5.block_size_;
      uVar7 = *(ushort *)((long)puVar13 + (long)pHVar65 * 2);
      uVar38 = (ulong)uVar7;
      uVar76 = 0;
      if (uVar69 <= uVar38) {
        uVar76 = uVar38 - uVar69;
      }
      do {
        uVar49 = (uint)ringbuffer_mask;
        if (uVar38 <= uVar76) break;
        uVar38 = uVar38 - 1;
        pHVar56 = (Hasher *)
                  ((long)local_168 -
                  (ulong)puVar14[lVar61 + (ulong)((hasher->privat)._H6.block_mask_ & (uint)uVar38)])
        ;
        if ((pHVar56 <= pHVar43) &&
           (puVar73 = (uint8_t *)((long)(pHVar75->common).extra + uVar37),
           puVar73 <= ringbuffer_mask)) {
          uVar40 = (ulong)(puVar14[lVar61 + (ulong)((hasher->privat)._H6.block_mask_ & (uint)uVar38)
                                  ] & uVar49);
          puVar67 = (uint8_t *)((long)(pHVar75->common).extra + uVar40);
          if ((puVar67 <= ringbuffer_mask) &&
             ((ringbuffer[(long)puVar73] == ringbuffer[(long)puVar67] &&
              ((int)*plVar3 == *(int *)(ringbuffer + uVar40))))) {
            puVar62 = (ulong *)(ringbuffer + uVar40 + 4);
            puVar41 = (ulong *)((long)plVar3 + 4);
            puVar39 = puVar62;
            for (puVar45 = (undefined1 *)((long)&pHVar55[-1].privat + 0x41c);
                (undefined1 *)0x7 < puVar45; puVar45 = puVar45 + -8) {
              uVar40 = *puVar41;
              uVar46 = *puVar39;
              if (uVar40 == uVar46) {
                puVar39 = puVar39 + 1;
              }
              else {
                uVar24 = 0;
                if ((uVar46 ^ uVar40) != 0) {
                  for (; ((uVar46 ^ uVar40) >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                  }
                }
                unaff_R14 = (Hasher *)((long)puVar39 + ((uVar24 >> 3 & 0x1fffffff) - (long)puVar62))
                ;
              }
              if (uVar40 != uVar46) goto LAB_0030cbf6;
              puVar41 = puVar41 + 1;
            }
            puVar63 = puVar39;
            if (puVar45 != (undefined1 *)0x0) {
              puVar63 = (ulong *)((long)puVar39 + (long)puVar45);
              puVar70 = (undefined1 *)0x0;
              do {
                if (*(char *)((long)puVar39 + (long)puVar70) !=
                    *(char *)((long)puVar41 + (long)puVar70)) {
                  puVar63 = (ulong *)((long)puVar39 + (long)puVar70);
                  break;
                }
                puVar70 = puVar70 + 1;
              } while (puVar45 != puVar70);
            }
            unaff_R14 = (Hasher *)((long)puVar63 - (long)puVar62);
LAB_0030cbf6:
            unaff_R14 = (Hasher *)((long)(unaff_R14->common).extra + 4);
            iVar50 = 0x1f;
            if ((uint)pHVar56 != 0) {
              for (; (uint)pHVar56 >> iVar50 == 0; iVar50 = iVar50 + -1) {
              }
            }
            uVar40 = (ulong)(iVar50 * -0x1e + 0x780) + (long)unaff_R14 * 0x87;
            if (local_160 < uVar40) {
              pHVar75 = unaff_R14;
              local_170 = pHVar56;
              local_160 = uVar40;
              local_148 = unaff_R14;
            }
          }
        }
      } while (pHVar56 <= pHVar43);
      puVar14[lVar61 + (ulong)((hasher->privat)._H6.block_mask_ & (uint)uVar7)] =
           (uint32_t)local_168;
      *(ushort *)((long)puVar13 + (long)pHVar65 * 2) = uVar7 + 1;
      local_14c = 0;
      if ((local_160 == 0x7e4) &&
         (pHVar20 = (hasher->privat)._H6.common_,
         pHVar20->dict_num_lookups >> 7 <= pHVar20->dict_num_matches)) {
        pHVar65 = (Hasher *)
                  (ulong)(*(uint32_t *)(pHVar30->common).extra * 0x1e35a7bd >> 0x11 & 0xfffffffe);
        puVar73 = pBVar15->hash_table_lengths;
        sVar57 = pHVar20->dict_num_lookups;
        local_14c = 0;
        pHVar75 = hasher;
        lVar61 = 0;
        do {
          sVar57 = sVar57 + 1;
          pHVar20->dict_num_lookups = sVar57;
          bVar32 = *(byte *)((long)(pHVar65->common).extra + (long)puVar73);
          pHVar56 = (Hasher *)(ulong)bVar32;
          if (pHVar56 != (Hasher *)0x0) {
            unaff_R14 = (Hasher *)CONCAT71((int7)((ulong)unaff_R14 >> 8),1);
            if (pHVar56 <= pHVar55) {
              pBVar21 = pBVar15->words;
              puVar41 = (ulong *)(pBVar21->data +
                                 (ulong)pBVar21->offsets_by_length[(long)pHVar56] +
                                 (ulong)pBVar15->hash_table_words[(long)pHVar65] * (long)pHVar56);
              pHVar66 = pHVar56;
              pHVar74 = pHVar30;
              if (7 < bVar32) {
                do {
                  pvVar17 = (void *)*puVar41;
                  pvVar18 = (pHVar74->common).extra[0];
                  if (pvVar17 == pvVar18) {
                    pHVar74 = (Hasher *)((pHVar74->common).extra + 1);
                  }
                  else {
                    uVar76 = 0;
                    if (((ulong)pvVar18 ^ (ulong)pvVar17) != 0) {
                      for (; (((ulong)pvVar18 ^ (ulong)pvVar17) >> uVar76 & 1) == 0;
                          uVar76 = uVar76 + 1) {
                      }
                    }
                    pHVar75 = (Hasher *)
                              ((long)pHVar74 + ((uVar76 >> 3 & 0x1fffffff) - (long)pHVar30));
                  }
                  if (pvVar17 != pvVar18) goto LAB_0030cdb0;
                  puVar41 = puVar41 + 1;
                  pHVar66 = (Hasher *)((long)&pHVar66[-1].privat + 0x418);
                } while ((Hasher *)0x7 < pHVar66);
              }
              pHVar75 = pHVar74;
              if (pHVar66 != (Hasher *)0x0) {
                pHVar75 = (Hasher *)((long)(pHVar74->common).extra + (long)(pHVar66->common).extra);
                pHVar52 = (Hasher *)0x0;
                do {
                  if (*(uint8_t *)((long)(pHVar74->common).extra + (long)(pHVar52->common).extra) !=
                      *(uint8_t *)((long)puVar41 + (long)pHVar52)) {
                    pHVar75 = (Hasher *)
                              ((long)(pHVar74->common).extra + (long)(pHVar52->common).extra);
                    break;
                  }
                  pHVar52 = (Hasher *)((long)(pHVar52->common).extra + 1);
                } while (pHVar66 != pHVar52);
              }
              pHVar75 = (Hasher *)((long)pHVar75 - (long)pHVar30);
              pHVar74 = pHVar75;
LAB_0030cdb0:
              unaff_R14 = (Hasher *)CONCAT71((int7)((ulong)pHVar74 >> 8),1);
              if (((pHVar75 != (Hasher *)0x0) &&
                  (pHVar56 < (Hasher *)
                             ((long)(pHVar75->common).extra + (ulong)pBVar15->cutoffTransformsCount)
                  )) && (pHVar56 = (Hasher *)
                                   ((long)(pHVar36->common).extra +
                                   ((ulong)((uint)(pBVar15->cutoffTransforms >>
                                                  ((char)((long)pHVar56 - (long)pHVar75) * '\x06' &
                                                  0x3fU)) & 0x3f) +
                                    ((long)pHVar56 - (long)pHVar75) * 4 <<
                                   (*(byte *)((long)(pHVar56->common).extra + (long)pBVar21) & 0x3f)
                                   ) + (ulong)pBVar15->hash_table_words[(long)pHVar65] + lVar51),
                        pHVar56 <= pHVar16)) {
                iVar50 = 0x1f;
                if ((uint)pHVar56 != 0) {
                  for (; (uint)pHVar56 >> iVar50 == 0; iVar50 = iVar50 + -1) {
                  }
                }
                uVar76 = ((long)pHVar75 * 0x87 - (ulong)(uint)(iVar50 * 0x1e)) + 0x780;
                if (local_160 <= uVar76) {
                  local_14c = (uint)bVar32 - (int)pHVar75;
                  unaff_R14 = (Hasher *)0x0;
                  local_170 = pHVar56;
                  local_148 = pHVar75;
                  local_160 = uVar76;
                }
              }
            }
            if ((char)unaff_R14 == '\0') {
              pHVar20->dict_num_matches = pHVar20->dict_num_matches + 1;
            }
          }
          pHVar65 = (Hasher *)((long)(pHVar65->common).extra + 1);
          bVar78 = lVar61 == 0;
          lVar61 = lVar61 + 1;
        } while (bVar78);
      }
      local_110 = local_148;
      if ((Hasher *)0x1f < pHVar55) {
        pHVar75 = (Hasher *)(hasher->privat)._H35.ha_common.extra[3];
        if (pHVar75 <= local_168) {
          uVar71 = (hasher->privat)._H65.hb.state;
          uVar28 = (hasher->privat)._H65.hb.factor;
          uVar60 = (hasher->privat)._H65.hb.factor_remove;
          do {
            uVar33 = uVar71 & 0x3fffffff;
            bVar32 = ringbuffer[(ulong)pHVar75 & ringbuffer_mask];
            bVar64 = ringbuffer[(ulong)&(pHVar75->common).is_setup_ & ringbuffer_mask];
            if (uVar33 < 0x1000000) {
              pvVar17 = (hasher->privat)._H35.ha_common.extra[2];
              uVar9 = *(uint *)((long)pvVar17 + (ulong)uVar33 * 4);
              *(int *)((long)pvVar17 + (ulong)uVar33 * 4) = (int)pHVar75;
              if ((pHVar75 == local_168) && (uVar9 != 0xffffffff)) {
                uVar33 = (uint32_t)local_168 - uVar9;
                if ((Hasher *)(ulong)uVar33 <= pHVar43) {
                  puVar39 = (ulong *)(ringbuffer + (uVar9 & uVar49));
                  pHVar56 = (Hasher *)0x0;
                  lVar61 = 0;
                  puVar41 = puVar39;
                  do {
                    lVar53 = lVar61;
                    uVar76 = *(ulong *)((long)(pHVar30->common).extra +
                                       (long)(pHVar56->common).extra);
                    uVar38 = *puVar41;
                    if (uVar76 == uVar38) {
                      puVar41 = puVar41 + 1;
                    }
                    else {
                      uVar40 = 0;
                      if ((uVar38 ^ uVar76) != 0) {
                        for (; ((uVar38 ^ uVar76) >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                        }
                      }
                      pHVar65 = (Hasher *)
                                ((long)puVar41 + ((uVar40 >> 3 & 0x1fffffff) - (long)puVar39));
                    }
                    if (uVar76 != uVar38) goto LAB_0030d06d;
                    pHVar56 = (Hasher *)((pHVar56->common).extra + 1);
                    lVar61 = lVar53 + -8;
                  } while ((uint8_t *)0x7 < (uint8_t *)((long)(pHVar55->common).extra + lVar53 + -8)
                          );
                  if (pHVar55 != pHVar56) {
                    puVar63 = (ulong *)((long)puVar41 + ((long)&pHVar55->common - (long)pHVar56));
                    pHVar65 = (Hasher *)(8 - lVar53);
                    puVar62 = puVar41;
                    do {
                      puVar41 = puVar62;
                      if ((uint8_t)*puVar62 !=
                          *(uint8_t *)
                           ((long)(pHVar30->common).extra + (long)(pHVar65->common).extra)) break;
                      puVar62 = (ulong *)((long)puVar62 + 1);
                      pHVar65 = (Hasher *)((long)(pHVar65->common).extra + 1);
                      puVar41 = puVar63;
                    } while (pHVar55 != pHVar65);
                  }
                  pHVar65 = (Hasher *)((long)puVar41 - (long)puVar39);
LAB_0030d06d:
                  if (((Hasher *)0x3 < pHVar65) && (local_148 < pHVar65)) {
                    iVar50 = 0x1f;
                    if (uVar33 != 0) {
                      for (; uVar33 >> iVar50 == 0; iVar50 = iVar50 + -1) {
                      }
                    }
                    uVar76 = (ulong)(iVar50 * -0x1e + 0x780) + (long)pHVar65 * 0x87;
                    if (local_160 < uVar76) {
                      local_14c = 0;
                      local_170 = (Hasher *)(ulong)uVar33;
                      local_148 = pHVar65;
                      local_160 = uVar76;
                    }
                  }
                }
              }
            }
            unaff_R14 = (Hasher *)(ulong)uVar60;
            uVar71 = ~(uint)bVar32 * uVar60 + (uint)bVar64 + uVar71 * uVar28 + 1;
            pHVar75 = (Hasher *)((long)(pHVar75->common).extra + 1);
          } while (pHVar75 <= local_168);
          (hasher->privat)._H65.hb.state = uVar71;
        }
        (hasher->privat)._H35.ha_common.extra[3] = (uint8_t *)((long)(local_168->common).extra + 1);
        local_110 = local_148;
      }
      sVar57 = (params->dictionary).compound.num_chunks;
      sVar22 = (params->dictionary).compound.total_size;
      pHVar43 = local_110;
      if (sVar57 != 0) {
        sVar72 = 0;
        do {
          pPVar23 = (params->dictionary).compound.chunks[sVar72];
          bVar32 = (byte)pPVar23->bucket_bits;
          bVar64 = (byte)pPVar23->slot_bits;
          bVar27 = -(char)pPVar23->hash_bits;
          uVar76 = ((ulong)((long)(pHVar30->common).extra[0] << (bVar27 & 0x3f)) >> (bVar27 & 0x3f))
                   * 0x1fe35a7bd3579bd3 >> (-bVar32 & 0x3f);
          pHVar75 = (Hasher *)(&pPVar23[1].magic + (1L << (bVar64 & 0x3f)));
          pHVar43 = (Hasher *)((long)(pHVar75->common).extra + (1L << (bVar32 & 0x3f)) * 2);
          bVar64 = -bVar64;
          puVar42 = (uint32_t *)((long)(pHVar43->common).extra + (ulong)pPVar23->num_items * 4);
          if (pPVar23->magic != 0xdebcede0) {
            puVar42 = *(uint32_t **)puVar42;
          }
          pHVar56 = (Hasher *)
                    ((long)pHVar36 + (sVar22 - (params->dictionary).compound.chunk_offsets[sVar72]))
          ;
          uVar38 = (ulong)pPVar23->source_size;
          uVar7 = *(ushort *)((long)(pHVar75->common).extra + (uVar76 & 0xffffffff) * 2);
          puVar58 = (uint32_t *)
                    ((long)(pHVar43->common).extra +
                    (ulong)((uint)uVar7 +
                           (&pPVar23[1].magic)
                           [(uint)((int)uVar76 << (bVar64 & 0x1f)) >> (bVar64 & 0x1f)]) * 4);
          lVar61 = 0;
          pHVar65 = local_110;
          do {
            pHVar66 = (Hasher *)(long)dist_cache[lVar61];
            if (((Hasher *)((long)pHVar56 - uVar38) < pHVar66) && (pHVar66 <= pHVar56)) {
              pHVar75 = (Hasher *)(uVar38 - ((long)pHVar56 - (long)pHVar66));
              if (pHVar55 <= pHVar75) {
                pHVar75 = pHVar55;
              }
              puVar39 = (ulong *)((long)puVar42 + ((long)pHVar56 - (long)pHVar66));
              pHVar74 = pHVar30;
              puVar41 = puVar39;
              for (; (Hasher *)0x7 < pHVar75;
                  pHVar75 = (Hasher *)((long)&pHVar75[-1].privat + 0x418)) {
                pvVar17 = (pHVar74->common).extra[0];
                pvVar18 = (void *)*puVar41;
                if (pvVar17 == pvVar18) {
                  puVar41 = puVar41 + 1;
                }
                else {
                  uVar76 = 0;
                  if (((ulong)pvVar18 ^ (ulong)pvVar17) != 0) {
                    for (; (((ulong)pvVar18 ^ (ulong)pvVar17) >> uVar76 & 1) == 0;
                        uVar76 = uVar76 + 1) {
                    }
                  }
                  unaff_R14 = (Hasher *)((long)puVar41 - (long)puVar39);
                  pHVar43 = (Hasher *)((long)(unaff_R14->common).extra + (uVar76 >> 3 & 0x1fffffff))
                  ;
                }
                if (pvVar17 != pvVar18) goto LAB_0030d2a0;
                pHVar74 = (Hasher *)((pHVar74->common).extra + 1);
              }
              puVar62 = puVar41;
              if (pHVar75 != (Hasher *)0x0) {
                puVar62 = (ulong *)((long)puVar41 + (long)pHVar75);
                pHVar43 = (Hasher *)0x0;
                do {
                  unaff_R14 = (Hasher *)
                              CONCAT71((int7)((ulong)unaff_R14 >> 8),
                                       *(uint8_t *)((long)puVar41 + (long)pHVar43));
                  if (*(uint8_t *)((long)puVar41 + (long)pHVar43) !=
                      *(uint8_t *)((long)(pHVar74->common).extra + (long)(pHVar43->common).extra)) {
                    puVar62 = (ulong *)((long)puVar41 + (long)pHVar43);
                    break;
                  }
                  pHVar43 = (Hasher *)((long)(pHVar43->common).extra + 1);
                } while (pHVar75 != pHVar43);
              }
              pHVar43 = (Hasher *)((long)puVar62 - (long)puVar39);
LAB_0030d2a0:
              if (((Hasher *)0x1 < pHVar43) &&
                 (uVar76 = (long)pHVar43 * 0x87 + 0x78f, local_160 < uVar76)) {
                if (lVar61 != 0) {
                  uVar76 = uVar76 - ((0x1ca10U >> ((byte)lVar61 & 2) & 4) + 0x27);
                }
                if (local_160 < uVar76) {
                  if (pHVar65 < pHVar43) {
                    pHVar65 = pHVar43;
                  }
                  local_14c = 0;
                  local_170 = pHVar66;
                  local_160 = uVar76;
                  local_110 = pHVar43;
                }
              }
            }
            lVar61 = lVar61 + 1;
          } while (lVar61 != 4);
          if (uVar7 != 0xffff) {
            do {
              uVar71 = *puVar58;
              uVar76 = (ulong)(uVar71 & 0x7fffffff);
              pHVar66 = (Hasher *)((long)pHVar56 - uVar76);
              pHVar43 = (Hasher *)(uVar38 - uVar76);
              if (pHVar55 <= (Hasher *)(uVar38 - uVar76)) {
                pHVar43 = pHVar55;
              }
              if ((((pHVar66 <= pHVar16) &&
                   (puVar73 = (uint8_t *)((long)(pHVar65->common).extra + uVar37),
                   puVar73 <= ringbuffer_mask)) && (pHVar65 < pHVar43)) &&
                 (ringbuffer[(long)puVar73] ==
                  *(uint8_t *)((long)puVar42 + (long)((long)(pHVar65->common).extra + uVar76)))) {
                puVar67 = (uint8_t *)((long)puVar42 + uVar76);
                pHVar74 = pHVar30;
                puVar73 = puVar67;
                for (; (Hasher *)0x7 < pHVar43;
                    pHVar43 = (Hasher *)((long)&pHVar43[-1].privat + 0x418)) {
                  unaff_R14 = (Hasher *)(pHVar74->common).extra[0];
                  pHVar52 = *(Hasher **)puVar73;
                  if (unaff_R14 == pHVar52) {
                    puVar73 = puVar73 + 8;
                  }
                  else {
                    uVar76 = 0;
                    if (((ulong)pHVar52 ^ (ulong)unaff_R14) != 0) {
                      for (; (((ulong)pHVar52 ^ (ulong)unaff_R14) >> uVar76 & 1) == 0;
                          uVar76 = uVar76 + 1) {
                      }
                    }
                    pHVar75 = (Hasher *)(puVar73 + ((uVar76 >> 3 & 0x1fffffff) - (long)puVar67));
                  }
                  if (unaff_R14 != pHVar52) goto LAB_0030d3f8;
                  pHVar74 = (Hasher *)((pHVar74->common).extra + 1);
                }
                puVar44 = puVar73;
                if (pHVar43 != (Hasher *)0x0) {
                  puVar44 = puVar73 + (long)pHVar43;
                  pHVar75 = (Hasher *)0x0;
                  do {
                    if (puVar73[(long)pHVar75] !=
                        *(uint8_t *)((long)(pHVar74->common).extra + (long)(pHVar75->common).extra))
                    {
                      puVar44 = puVar73 + (long)pHVar75;
                      break;
                    }
                    pHVar75 = (Hasher *)((long)(pHVar75->common).extra + 1);
                  } while (pHVar43 != pHVar75);
                }
                pHVar75 = (Hasher *)(puVar44 + -(long)puVar67);
LAB_0030d3f8:
                if ((Hasher *)0x3 < pHVar75) {
                  iVar50 = 0x1f;
                  if ((uint)pHVar66 != 0) {
                    for (; (uint)pHVar66 >> iVar50 == 0; iVar50 = iVar50 + -1) {
                    }
                  }
                  uVar76 = (ulong)(iVar50 * -0x1e + 0x780) + (long)pHVar75 * 0x87;
                  if (local_160 < uVar76) {
                    local_14c = 0;
                    pHVar65 = pHVar75;
                    local_170 = pHVar66;
                    local_160 = uVar76;
                    local_110 = pHVar75;
                  }
                }
              }
              puVar58 = puVar58 + 1;
            } while (-1 < (int)uVar71);
          }
          sVar72 = sVar72 + 1;
          pHVar43 = local_110;
        } while (sVar72 != sVar57);
      }
      if (local_160 < 0x7e5) {
        local_100 = (Hasher *)((long)(local_100->common).extra + 1);
        position = (long)(local_168->common).extra + 1;
        if (pHVar68 < position) {
          if ((Hasher *)((long)(pHVar68->common).extra + (ulong)(uint)((int)lVar35 * 4)) < position)
          {
            pHVar43 = (Hasher *)((long)(local_168->common).extra + 0x11);
            if (pHVar1 <= pHVar43) {
              pHVar43 = pHVar1;
            }
            if (position < pHVar43) {
              uVar49 = (hasher->privat)._H6.block_mask_;
              uVar10 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
              do {
                unaff_R14 = local_100;
                uVar37 = *(long *)(ringbuffer + (position & ringbuffer_mask)) * uVar19 >> 0x31;
                uVar7 = *(ushort *)((long)puVar13 + uVar37 * 2);
                *(ushort *)((long)puVar13 + uVar37 * 2) = uVar7 + 1;
                puVar14[(uVar37 << ((byte)uVar10 & 0x3f)) + (ulong)(uVar49 & uVar7)] =
                     (uint32_t)position;
                local_100 = (Hasher *)((long)(unaff_R14->common).extra + 4);
                position = (long)(((Hasher *)position)->common).extra + 4;
              } while (position < pHVar43);
            }
          }
          else {
            pHVar43 = (Hasher *)((long)(local_168->common).extra + 9);
            if (pHVar1 <= pHVar43) {
              pHVar43 = pHVar1;
            }
            if (position < pHVar43) {
              uVar49 = (hasher->privat)._H6.block_mask_;
              uVar10 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
              do {
                unaff_R14 = local_100;
                uVar37 = *(long *)(ringbuffer + (position & ringbuffer_mask)) * uVar19 >> 0x31;
                uVar7 = *(ushort *)((long)puVar13 + uVar37 * 2);
                *(ushort *)((long)puVar13 + uVar37 * 2) = uVar7 + 1;
                puVar14[(uVar37 << ((byte)uVar10 & 0x3f)) + (ulong)(uVar49 & uVar7)] =
                     (uint32_t)position;
                local_100 = (Hasher *)((long)(unaff_R14->common).extra + 2);
                position = (long)(((Hasher *)position)->common).extra + 2;
              } while (position < pHVar43);
            }
          }
        }
      }
      else {
        lVar61 = (lVar5 + num_bytes) - (long)local_168;
        local_110 = pHVar43;
        iVar50 = 0;
        do {
          pHVar36 = (Hasher *)((long)&pHVar55[-1].privat + 0x41f);
          pHVar68 = (Hasher *)((long)&local_110[-1].privat + 0x41f);
          if (pHVar36 <= pHVar68) {
            pHVar68 = pHVar36;
          }
          if (4 < params->quality) {
            pHVar68 = (Hasher *)0x0;
          }
          pHVar75 = (Hasher *)((long)(local_168->common).extra + 1);
          pHVar30 = pHVar6;
          if (pHVar75 < pHVar6) {
            pHVar30 = pHVar75;
          }
          pHVar65 = (Hasher *)((long)(local_168->common).extra + sVar11 + 1);
          if (pHVar6 <= pHVar65) {
            pHVar65 = pHVar6;
          }
          if ((params->dictionary).contextual.context_based != 0) {
            local_d4 = (uint)(params->dictionary).contextual.context_map
                             [literal_context_lut[local_58 + 0x100] |
                              literal_context_lut[ringbuffer[(ulong)local_168 & ringbuffer_mask]]];
            local_58 = (ulong)ringbuffer[(ulong)local_168 & ringbuffer_mask];
          }
          pBVar15 = (params->dictionary).contextual.dict[local_d4];
          uVar76 = (ulong)pHVar75 & ringbuffer_mask;
          uVar37 = (ulong)(hasher->privat)._H6.num_last_distances_to_check_;
          if (uVar37 == 0) {
            local_188 = 0x7e4;
            local_128 = (Hasher *)0x0;
            local_190 = (Hasher *)0x0;
          }
          else {
            local_188 = 0x7e4;
            uVar38 = 0;
            local_190 = (Hasher *)0x0;
            local_128 = (Hasher *)0x0;
            do {
              pHVar56 = (Hasher *)(long)dist_cache[uVar38];
              if (((pHVar56 <= pHVar30) && ((Hasher *)((long)pHVar75 - (long)pHVar56) < pHVar75)) &&
                 (puVar73 = (uint8_t *)((long)(pHVar68->common).extra + uVar76),
                 puVar73 <= ringbuffer_mask)) {
                uVar40 = (ulong)((long)pHVar75 - (long)pHVar56) & ringbuffer_mask;
                puVar67 = (uint8_t *)((long)(pHVar68->common).extra + uVar40);
                if ((puVar67 <= ringbuffer_mask) &&
                   (pHVar66 = (Hasher *)
                              CONCAT71((int7)((ulong)puVar73 >> 8),ringbuffer[(long)puVar73]),
                   ringbuffer[(long)puVar73] == ringbuffer[(long)puVar67])) {
                  puVar44 = ringbuffer + uVar40;
                  puVar73 = ringbuffer + uVar76;
                  puVar67 = puVar44;
                  for (pHVar74 = pHVar36; (Hasher *)0x7 < pHVar74;
                      pHVar74 = (Hasher *)((long)&pHVar74[-1].privat + 0x418)) {
                    pHVar52 = *(Hasher **)puVar73;
                    pHVar43 = *(Hasher **)puVar67;
                    if (pHVar52 == pHVar43) {
                      puVar67 = puVar67 + 8;
                    }
                    else {
                      uVar40 = 0;
                      if (((ulong)pHVar43 ^ (ulong)pHVar52) != 0) {
                        for (; (((ulong)pHVar43 ^ (ulong)pHVar52) >> uVar40 & 1) == 0;
                            uVar40 = uVar40 + 1) {
                        }
                      }
                      pHVar66 = (Hasher *)(puVar67 + ((uVar40 >> 3 & 0x1fffffff) - (long)puVar44));
                    }
                    if (pHVar52 != pHVar43) goto LAB_0030d6b3;
                    puVar73 = puVar73 + 8;
                  }
                  if (pHVar74 != (Hasher *)0x0) {
                    pHVar66 = (Hasher *)0x0;
                    do {
                      pHVar52 = pHVar66;
                      if (puVar67[(long)pHVar66] != puVar73[(long)pHVar66]) break;
                      pHVar66 = (Hasher *)((long)(pHVar66->common).extra + 1);
                      pHVar52 = pHVar74;
                    } while (pHVar74 != pHVar66);
                    puVar67 = puVar67 + (long)pHVar52;
                  }
                  pHVar66 = (Hasher *)(puVar67 + -(long)puVar44);
LAB_0030d6b3:
                  if ((((Hasher *)0x2 < pHVar66) || ((uVar38 < 2 && (pHVar66 == (Hasher *)0x2)))) &&
                     (uVar40 = (long)pHVar66 * 0x87 + 0x78f, local_188 < uVar40)) {
                    if (uVar38 != 0) {
                      uVar40 = uVar40 - ((0x1ca10U >> ((byte)uVar38 & 0xe) & 0xe) + 0x27);
                    }
                    if (local_188 < uVar40) {
                      pHVar68 = pHVar66;
                      local_190 = pHVar66;
                      local_188 = uVar40;
                      local_128 = pHVar56;
                    }
                  }
                }
              }
              uVar38 = uVar38 + 1;
            } while (uVar38 != uVar37);
          }
          puVar4 = (uint *)(ringbuffer + uVar76);
          uVar40 = *(long *)puVar4 * uVar19 >> 0x31;
          lVar53 = uVar40 << (*(byte *)((long)&hasher->privat + 0x1c) & 0x3f);
          puVar41 = (ulong *)(ringbuffer + uVar76);
          uVar7 = *(ushort *)((long)puVar13 + uVar40 * 2);
          uVar38 = (ulong)uVar7;
          uVar37 = 0;
          if (uVar69 <= uVar38) {
            uVar37 = uVar38 - uVar69;
          }
          unaff_R14 = (Hasher *)(ulong)*puVar4;
          do {
            if (uVar38 <= uVar37) break;
            uVar38 = uVar38 - 1;
            pHVar43 = (Hasher *)
                      ((long)pHVar75 -
                      (ulong)puVar14[lVar53 + (ulong)((hasher->privat)._H6.block_mask_ &
                                                     (uint)uVar38)]);
            if ((pHVar43 <= pHVar30) &&
               (puVar73 = (uint8_t *)((long)(pHVar68->common).extra + uVar76),
               puVar73 <= ringbuffer_mask)) {
              uVar46 = (ulong)(puVar14[lVar53 + (ulong)((hasher->privat)._H6.block_mask_ &
                                                       (uint)uVar38)] & uVar49);
              puVar67 = (uint8_t *)((long)(pHVar68->common).extra + uVar46);
              if ((puVar67 <= ringbuffer_mask) &&
                 ((ringbuffer[(long)puVar73] == ringbuffer[(long)puVar67] &&
                  (*puVar4 == *(uint *)(ringbuffer + uVar46))))) {
                puVar63 = (ulong *)(ringbuffer + uVar46 + 4);
                puVar39 = (ulong *)(puVar4 + 1);
                puVar62 = puVar63;
                puVar73 = ringbuffer;
                for (puVar45 = (undefined1 *)((long)&pHVar55[-1].privat + 0x41b);
                    (undefined1 *)0x7 < puVar45; puVar45 = puVar45 + -8) {
                  uVar46 = *puVar39;
                  uVar24 = *puVar62;
                  if (uVar46 == uVar24) {
                    puVar62 = puVar62 + 1;
                  }
                  else {
                    uVar26 = 0;
                    if ((uVar24 ^ uVar46) != 0) {
                      for (; ((uVar24 ^ uVar46) >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                      }
                    }
                    puVar73 = (uint8_t *)
                              ((long)puVar62 + ((uVar26 >> 3 & 0x1fffffff) - (long)puVar63));
                  }
                  if (uVar46 != uVar24) goto LAB_0030d8d7;
                  puVar39 = puVar39 + 1;
                }
                puVar54 = puVar62;
                if (puVar45 != (undefined1 *)0x0) {
                  puVar54 = (ulong *)((long)puVar62 + (long)puVar45);
                  puVar70 = (undefined1 *)0x0;
                  do {
                    if (*(char *)((long)puVar62 + (long)puVar70) !=
                        *(char *)((long)puVar39 + (long)puVar70)) {
                      puVar54 = (ulong *)((long)puVar62 + (long)puVar70);
                      break;
                    }
                    puVar70 = puVar70 + 1;
                  } while (puVar45 != puVar70);
                }
                puVar73 = (uint8_t *)((long)puVar54 - (long)puVar63);
LAB_0030d8d7:
                pHVar56 = (Hasher *)(puVar73 + 4);
                iVar34 = 0x1f;
                if ((uint)pHVar43 != 0) {
                  for (; (uint)pHVar43 >> iVar34 == 0; iVar34 = iVar34 + -1) {
                  }
                }
                uVar46 = (ulong)(iVar34 * -0x1e + 0x780) + (long)pHVar56 * 0x87;
                if (local_188 < uVar46) {
                  pHVar68 = pHVar56;
                  local_190 = pHVar56;
                  local_188 = uVar46;
                  local_128 = pHVar43;
                }
              }
            }
          } while (pHVar43 <= pHVar30);
          puVar14[lVar53 + (ulong)((hasher->privat)._H6.block_mask_ & (uint)uVar7)] =
               (uint32_t)pHVar75;
          uVar71 = uVar7 + 1;
          pHVar68 = (Hasher *)(ulong)uVar71;
          *(short *)((long)puVar13 + uVar40 * 2) = (short)uVar71;
          if ((local_188 == 0x7e4) &&
             (pHVar20 = (hasher->privat)._H6.common_,
             pHVar20->dict_num_lookups >> 7 <= pHVar20->dict_num_matches)) {
            uVar37 = (ulong)((uint)((int)*puVar41 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
            puVar73 = pBVar15->hash_table_lengths;
            sVar72 = pHVar20->dict_num_lookups;
            local_148._0_4_ = 0;
            pHVar55 = (Hasher *)0x0;
            do {
              sVar72 = sVar72 + 1;
              pHVar20->dict_num_lookups = sVar72;
              bVar32 = puVar73[uVar37];
              pHVar43 = (Hasher *)(ulong)bVar32;
              if (pHVar43 != (Hasher *)0x0) {
                bVar78 = true;
                if (pHVar43 <= pHVar36) {
                  unaff_R14 = (Hasher *)(ulong)pBVar15->hash_table_words[uVar37];
                  pBVar21 = pBVar15->words;
                  puVar62 = (ulong *)(pBVar21->data +
                                     (ulong)pBVar21->offsets_by_length[(long)pHVar43] +
                                     (long)unaff_R14 * (long)pHVar43);
                  pHVar56 = pHVar43;
                  puVar39 = puVar41;
                  if (7 < bVar32) {
                    do {
                      uVar38 = *puVar62;
                      uVar40 = *puVar39;
                      if (uVar38 == uVar40) {
                        puVar39 = puVar39 + 1;
                      }
                      else {
                        uVar46 = 0;
                        if ((uVar40 ^ uVar38) != 0) {
                          for (; ((uVar40 ^ uVar38) >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                          }
                        }
                        pHVar68 = (Hasher *)
                                  ((long)puVar39 + ((uVar46 >> 3 & 0x1fffffff) - (long)puVar41));
                      }
                      if (uVar38 != uVar40) goto LAB_0030dc70;
                      puVar62 = puVar62 + 1;
                      pHVar56 = (Hasher *)((long)&pHVar56[-1].privat + 0x418);
                    } while ((Hasher *)0x7 < pHVar56);
                  }
                  puVar63 = puVar39;
                  if (pHVar56 != (Hasher *)0x0) {
                    puVar63 = (ulong *)((long)puVar39 + (long)pHVar56);
                    pHVar68 = (Hasher *)0x0;
                    do {
                      if (*(uint8_t *)((long)puVar39 + (long)pHVar68) !=
                          *(uint8_t *)((long)puVar62 + (long)pHVar68)) {
                        puVar63 = (ulong *)((long)puVar39 + (long)pHVar68);
                        break;
                      }
                      pHVar68 = (Hasher *)((long)(pHVar68->common).extra + 1);
                    } while (pHVar56 != pHVar68);
                  }
                  pHVar68 = (Hasher *)((long)puVar63 - (long)puVar41);
LAB_0030dc70:
                  bVar78 = true;
                  if ((pHVar68 != (Hasher *)0x0) &&
                     (pHVar43 < (Hasher *)
                                ((long)(pHVar68->common).extra +
                                (ulong)pBVar15->cutoffTransformsCount))) {
                    unaff_R14 = (Hasher *)
                                ((uint8_t *)
                                 ((long)(pHVar65->common).extra +
                                 ((ulong)((uint)(pBVar15->cutoffTransforms >>
                                                ((char)((long)pHVar43 - (long)pHVar68) * '\x06' &
                                                0x3fU)) & 0x3f) +
                                  ((long)pHVar43 - (long)pHVar68) * 4 <<
                                 (*(byte *)((long)(pHVar43->common).extra + (long)pBVar21) & 0x3f))
                                 + lVar51) + (long)(unaff_R14->common).extra);
                    if (pHVar16 < unaff_R14) {
                      bVar78 = true;
                    }
                    else {
                      iVar34 = 0x1f;
                      if ((uint)unaff_R14 != 0) {
                        for (; (uint)unaff_R14 >> iVar34 == 0; iVar34 = iVar34 + -1) {
                        }
                      }
                      uVar38 = ((long)pHVar68 * 0x87 - (ulong)(uint)(iVar34 * 0x1e)) + 0x780;
                      bVar78 = true;
                      if (local_188 <= uVar38) {
                        local_148._0_4_ = (uint)bVar32 - (int)pHVar68;
                        bVar78 = false;
                        local_190 = pHVar68;
                        local_188 = uVar38;
                        local_128 = unaff_R14;
                      }
                    }
                  }
                }
                if (!bVar78) {
                  pHVar20->dict_num_matches = pHVar20->dict_num_matches + 1;
                }
              }
              pHVar43 = (Hasher *)((long)(pHVar55->common).extra + 1);
              uVar37 = uVar37 + 1;
              bVar78 = pHVar55 == (Hasher *)0x0;
              pHVar55 = pHVar43;
            } while (bVar78);
          }
          else {
            local_148._0_4_ = 0;
          }
          local_130 = local_190;
          if ((Hasher *)0x1f < pHVar36) {
            pHVar68 = (Hasher *)(hasher->privat)._H35.ha_common.extra[3];
            if (pHVar68 <= pHVar75) {
              uVar71 = (hasher->privat)._H65.hb.state;
              uVar28 = (hasher->privat)._H65.hb.factor;
              uVar60 = (hasher->privat)._H65.hb.factor_remove;
              do {
                uVar33 = uVar71 & 0x3fffffff;
                bVar32 = ringbuffer[(ulong)pHVar68 & ringbuffer_mask];
                bVar64 = ringbuffer[(ulong)&(pHVar68->common).is_setup_ & ringbuffer_mask];
                if (uVar33 < 0x1000000) {
                  pvVar17 = (hasher->privat)._H35.ha_common.extra[2];
                  uVar9 = *(uint *)((long)pvVar17 + (ulong)uVar33 * 4);
                  *(int *)((long)pvVar17 + (ulong)uVar33 * 4) = (int)pHVar68;
                  if ((pHVar68 == pHVar75) && (uVar9 != 0xffffffff)) {
                    uVar33 = (uint32_t)pHVar75 - uVar9;
                    if ((Hasher *)(ulong)uVar33 <= pHVar30) {
                      puVar62 = (ulong *)(ringbuffer + (uVar9 & uVar49));
                      lVar77 = 0;
                      lVar53 = 0;
                      puVar39 = puVar62;
                      do {
                        uVar37 = *(ulong *)((long)puVar41 + lVar53);
                        uVar38 = *puVar39;
                        if (uVar37 == uVar38) {
                          puVar39 = puVar39 + 1;
                        }
                        else {
                          uVar40 = 0;
                          if ((uVar38 ^ uVar37) != 0) {
                            for (; ((uVar38 ^ uVar37) >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                            }
                          }
                          pHVar43 = (Hasher *)
                                    ((long)puVar39 + ((uVar40 >> 3 & 0x1fffffff) - (long)puVar62));
                        }
                        if (uVar37 != uVar38) goto LAB_0030daf0;
                        lVar53 = lVar53 + 8;
                        lVar47 = lVar61 + lVar77;
                        lVar77 = lVar77 + -8;
                      } while (7 < lVar47 - 8U);
                      puVar63 = puVar39;
                      if (lVar53 != lVar61) {
                        pcVar48 = (char *)((long)puVar41 + lVar53);
                        lVar77 = lVar77 + lVar61;
                        puVar54 = (ulong *)((long)puVar39 + (lVar61 - lVar53));
                        do {
                          puVar63 = puVar39;
                          if ((char)*puVar39 != *pcVar48) break;
                          pcVar48 = pcVar48 + 1;
                          puVar39 = (ulong *)((long)puVar39 + 1);
                          lVar77 = lVar77 + -1;
                          puVar63 = puVar54;
                        } while (lVar77 != 0);
                      }
                      pHVar43 = (Hasher *)((long)puVar63 - (long)puVar62);
LAB_0030daf0:
                      if (((Hasher *)0x3 < pHVar43) && (local_190 < pHVar43)) {
                        iVar34 = 0x1f;
                        if (uVar33 != 0) {
                          for (; uVar33 >> iVar34 == 0; iVar34 = iVar34 + -1) {
                          }
                        }
                        uVar37 = (ulong)(iVar34 * -0x1e + 0x780) + (long)pHVar43 * 0x87;
                        if (local_188 < uVar37) {
                          local_148._0_4_ = 0;
                          local_190 = pHVar43;
                          local_188 = uVar37;
                          local_128 = (Hasher *)(ulong)uVar33;
                        }
                      }
                    }
                  }
                }
                unaff_R14 = (Hasher *)(ulong)uVar60;
                uVar71 = ~(uint)bVar32 * uVar60 + (uint)bVar64 + uVar71 * uVar28 + 1;
                pHVar68 = (Hasher *)((long)(pHVar68->common).extra + 1);
              } while (pHVar68 <= pHVar75);
              (hasher->privat)._H65.hb.state = uVar71;
            }
            (hasher->privat)._H35.ha_common.extra[3] =
                 (uint8_t *)((long)(local_168->common).extra + 2);
            local_130 = local_190;
          }
          if (sVar57 != 0) {
            sVar72 = 0;
            do {
              pPVar23 = (params->dictionary).compound.chunks[sVar72];
              bVar32 = (byte)pPVar23->bucket_bits;
              bVar64 = (byte)pPVar23->slot_bits;
              lVar53 = 1L << (bVar32 & 0x3f);
              bVar27 = -(char)pPVar23->hash_bits;
              uVar37 = ((*puVar41 << (bVar27 & 0x3f)) >> (bVar27 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
                       (-bVar32 & 0x3f);
              pHVar68 = (Hasher *)(&pPVar23[1].magic + (1L << (bVar64 & 0x3f)));
              bVar64 = -bVar64;
              puVar73 = (uint8_t *)
                        ((long)(pHVar68->common).extra + (ulong)pPVar23->num_items * 4 + lVar53 * 2)
              ;
              if (pPVar23->magic != 0xdebcede0) {
                puVar73 = *(uint8_t **)puVar73;
              }
              pHVar30 = (Hasher *)
                        ((long)pHVar65 +
                        (sVar22 - (params->dictionary).compound.chunk_offsets[sVar72]));
              uVar38 = (ulong)pPVar23->source_size;
              uVar7 = *(ushort *)((long)(pHVar68->common).extra + (uVar37 & 0xffffffff) * 2);
              pHVar43 = (Hasher *)
                        ((long)(pHVar68->common).extra +
                        (ulong)((uint)uVar7 +
                               (&pPVar23[1].magic)
                               [(uint)((int)uVar37 << (bVar64 & 0x1f)) >> (bVar64 & 0x1f)]) * 4 +
                        lVar53 * 2);
              lVar53 = 0;
              pHVar55 = local_130;
              do {
                pHVar56 = (Hasher *)(long)dist_cache[lVar53];
                if (((Hasher *)((long)pHVar30 - uVar38) < pHVar56) && (pHVar56 <= pHVar30)) {
                  unaff_R14 = (Hasher *)(uVar38 - ((long)pHVar30 - (long)pHVar56));
                  if (pHVar36 <= unaff_R14) {
                    unaff_R14 = pHVar36;
                  }
                  puVar63 = (ulong *)(puVar73 + ((long)pHVar30 - (long)pHVar56));
                  puVar39 = puVar41;
                  puVar62 = puVar63;
                  for (; (Hasher *)0x7 < unaff_R14;
                      unaff_R14 = (Hasher *)((long)&unaff_R14[-1].privat + 0x418)) {
                    uVar37 = *puVar39;
                    uVar40 = *puVar62;
                    if (uVar37 == uVar40) {
                      puVar62 = puVar62 + 1;
                    }
                    else {
                      uVar46 = 0;
                      if ((uVar40 ^ uVar37) != 0) {
                        for (; ((uVar40 ^ uVar37) >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                        }
                      }
                      pHVar68 = (Hasher *)
                                ((long)puVar62 + ((uVar46 >> 3 & 0x1fffffff) - (long)puVar63));
                    }
                    if (uVar37 != uVar40) goto LAB_0030df0b;
                    puVar39 = puVar39 + 1;
                  }
                  puVar54 = puVar62;
                  if (unaff_R14 != (Hasher *)0x0) {
                    puVar54 = (ulong *)((long)puVar62 + (long)unaff_R14);
                    pHVar68 = (Hasher *)0x0;
                    do {
                      if (*(uint8_t *)((long)puVar62 + (long)pHVar68) !=
                          *(uint8_t *)((long)puVar39 + (long)pHVar68)) {
                        puVar54 = (ulong *)((long)puVar62 + (long)pHVar68);
                        break;
                      }
                      pHVar68 = (Hasher *)((long)(pHVar68->common).extra + 1);
                    } while (unaff_R14 != pHVar68);
                  }
                  pHVar68 = (Hasher *)((long)puVar54 - (long)puVar63);
LAB_0030df0b:
                  if (((Hasher *)0x1 < pHVar68) &&
                     (uVar37 = (long)pHVar68 * 0x87 + 0x78f, local_188 < uVar37)) {
                    if (lVar53 != 0) {
                      uVar37 = uVar37 - ((0x1ca10U >> ((byte)lVar53 & 2) & 4) + 0x27);
                    }
                    if (local_188 < uVar37) {
                      if (pHVar55 < pHVar68) {
                        pHVar55 = pHVar68;
                      }
                      local_148._0_4_ = 0;
                      local_188 = uVar37;
                      local_130 = pHVar68;
                      local_128 = pHVar56;
                    }
                  }
                }
                lVar53 = lVar53 + 1;
              } while (lVar53 != 4);
              if (uVar7 != 0xffff) {
                do {
                  uVar71 = *(uint *)(pHVar43->common).extra;
                  uVar37 = (ulong)(uVar71 & 0x7fffffff);
                  pHVar66 = (Hasher *)((long)pHVar30 - uVar37);
                  pHVar56 = (Hasher *)(uVar38 - uVar37);
                  if (pHVar36 <= (Hasher *)(uVar38 - uVar37)) {
                    pHVar56 = pHVar36;
                  }
                  if ((((pHVar66 <= pHVar16) &&
                       (puVar67 = (uint8_t *)((long)(pHVar55->common).extra + uVar76),
                       puVar67 <= ringbuffer_mask)) && (pHVar55 < pHVar56)) &&
                     (ringbuffer[(long)puVar67] ==
                      puVar73[(long)((long)(pHVar55->common).extra + uVar37)])) {
                    puVar44 = puVar73 + uVar37;
                    puVar39 = puVar41;
                    puVar67 = puVar44;
                    for (; (Hasher *)0x7 < pHVar56;
                        pHVar56 = (Hasher *)((long)&pHVar56[-1].privat + 0x418)) {
                      unaff_R14 = (Hasher *)*puVar39;
                      pHVar74 = *(Hasher **)puVar67;
                      if (unaff_R14 == pHVar74) {
                        puVar67 = puVar67 + 8;
                      }
                      else {
                        uVar37 = 0;
                        if (((ulong)pHVar74 ^ (ulong)unaff_R14) != 0) {
                          for (; (((ulong)pHVar74 ^ (ulong)unaff_R14) >> uVar37 & 1) == 0;
                              uVar37 = uVar37 + 1) {
                          }
                        }
                        pHVar68 = (Hasher *)(puVar67 + ((uVar37 >> 3 & 0x1fffffff) - (long)puVar44))
                        ;
                      }
                      if (unaff_R14 != pHVar74) goto LAB_0030e08d;
                      puVar39 = puVar39 + 1;
                    }
                    puVar31 = puVar67;
                    if (pHVar56 != (Hasher *)0x0) {
                      puVar31 = puVar67 + (long)pHVar56;
                      unaff_R14 = (Hasher *)0x0;
                      do {
                        if (puVar67[(long)unaff_R14] !=
                            *(uint8_t *)((long)puVar39 + (long)unaff_R14)) {
                          puVar31 = puVar67 + (long)unaff_R14;
                          break;
                        }
                        unaff_R14 = (Hasher *)((long)(unaff_R14->common).extra + 1);
                      } while (pHVar56 != unaff_R14);
                    }
                    pHVar68 = (Hasher *)(puVar31 + -(long)puVar44);
LAB_0030e08d:
                    if ((Hasher *)0x3 < pHVar68) {
                      iVar34 = 0x1f;
                      if ((uint)pHVar66 != 0) {
                        for (; (uint)pHVar66 >> iVar34 == 0; iVar34 = iVar34 + -1) {
                        }
                      }
                      uVar37 = (ulong)(iVar34 * -0x1e + 0x780) + (long)pHVar68 * 0x87;
                      if (local_188 < uVar37) {
                        local_148._0_4_ = 0;
                        pHVar55 = pHVar68;
                        local_188 = uVar37;
                        local_130 = pHVar68;
                        local_128 = pHVar66;
                      }
                    }
                  }
                  pHVar43 = (Hasher *)((long)(pHVar43->common).extra + 4);
                } while (-1 < (int)uVar71);
              }
              sVar72 = sVar72 + 1;
            } while (sVar72 != sVar57);
          }
          if (local_188 < local_160 + 0xaf) {
            bVar78 = false;
            iVar34 = iVar50;
          }
          else {
            local_100 = (Hasher *)((long)(local_100->common).extra + 1);
            iVar34 = iVar50 + 1;
            bVar78 = iVar50 < 3 && (uint8_t *)((long)(local_168->common).extra + 9) < puVar2;
            local_160 = local_188;
            local_170 = local_128;
            local_168 = pHVar75;
            local_14c = (int)local_148;
            local_110 = local_130;
          }
          lVar61 = lVar61 + -1;
          pHVar55 = pHVar36;
          iVar50 = iVar34;
        } while (bVar78);
        pHVar68 = (Hasher *)((long)(local_168->common).extra + sVar11);
        if (pHVar6 <= pHVar68) {
          pHVar68 = pHVar6;
        }
        pHVar68 = (Hasher *)((long)(pHVar68->common).extra + sVar12);
        if (pHVar68 < local_170) {
LAB_0030e39a:
          puVar73 = (uint8_t *)((long)(local_170->common).extra + 0xf);
        }
        else {
          uVar49 = 0;
          bVar78 = false;
          if (local_170 != (Hasher *)(long)*dist_cache) {
            if (local_170 == (Hasher *)(long)dist_cache[1]) {
              uVar49 = 1;
LAB_0030e1f9:
              bVar78 = false;
            }
            else {
              puVar73 = (uint8_t *)((long)local_170 + (3 - (long)*dist_cache));
              if (puVar73 < (uint8_t *)0x7) {
                iVar50 = (int)puVar73;
                uVar49 = 0x9750468;
              }
              else {
                puVar73 = (uint8_t *)((long)local_170 + (3 - (long)dist_cache[1]));
                if ((uint8_t *)0x6 < puVar73) {
                  if (local_170 != (Hasher *)(long)dist_cache[2]) {
                    bVar78 = local_170 != (Hasher *)(long)dist_cache[3];
                    uVar49 = 3;
                    goto LAB_0030e391;
                  }
                  uVar49 = 2;
                  goto LAB_0030e1f9;
                }
                iVar50 = (int)puVar73;
                uVar49 = 0xfdb1ace;
              }
              uVar49 = uVar49 >> ((byte)(iVar50 << 2) & 0x1f) & 0xf;
              bVar78 = false;
            }
          }
LAB_0030e391:
          if (bVar78) goto LAB_0030e39a;
          puVar73 = (uint8_t *)(ulong)uVar49;
        }
        if ((local_170 <= pHVar68) && (puVar73 != (uint8_t *)0x0)) {
          dist_cache[3] = dist_cache[2];
          uVar25 = *(undefined8 *)dist_cache;
          *(undefined8 *)(dist_cache + 1) = uVar25;
          iVar34 = (int)local_170;
          *dist_cache = iVar34;
          iVar50 = (hasher->privat)._H6.num_last_distances_to_check_;
          if (4 < iVar50) {
            dist_cache[4] = iVar34 + -1;
            dist_cache[5] = iVar34 + 1;
            dist_cache[6] = iVar34 + -2;
            dist_cache[7] = iVar34 + 2;
            dist_cache[8] = iVar34 + -3;
            dist_cache[9] = iVar34 + 3;
            if (10 < iVar50) {
              iVar50 = (int)uVar25;
              dist_cache[10] = iVar50 + -1;
              dist_cache[0xb] = iVar50 + 1;
              dist_cache[0xc] = iVar50 + -2;
              dist_cache[0xd] = iVar50 + 2;
              *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar50 + 3,iVar50 + -3);
            }
          }
        }
        uVar49 = (uint)local_100;
        local_e8->insert_len_ = uVar49;
        local_e8->copy_len_ = local_14c << 0x19 | (uint)local_110;
        uVar37 = (ulong)(params->dist).num_direct_distance_codes;
        puVar67 = (uint8_t *)(uVar37 + 0x10);
        if (puVar73 < puVar67) {
          local_e8->dist_prefix_ = (uint16_t)puVar73;
          uVar28 = 0;
        }
        else {
          uVar28 = (params->dist).distance_postfix_bits;
          bVar32 = (byte)uVar28;
          puVar73 = puVar73 + ((4L << (bVar32 & 0x3f)) - uVar37) + -0x10;
          uVar71 = 0x1f;
          if ((uint)puVar73 != 0) {
            for (; (uint)puVar73 >> uVar71 == 0; uVar71 = uVar71 - 1) {
            }
          }
          uVar71 = (uVar71 ^ 0xffffffe0) + 0x1f;
          bVar78 = ((ulong)puVar73 >> ((ulong)uVar71 & 0x3f) & 1) != 0;
          iVar50 = uVar71 - uVar28;
          local_e8->dist_prefix_ =
               (short)((uint)bVar78 + iVar50 * 2 + 0xfffe << (bVar32 & 0x3f)) +
               (short)puVar67 + (~(ushort)(-1 << (bVar32 & 0x1f)) & (ushort)puVar73) |
               (short)iVar50 * 0x400;
          uVar28 = (uint32_t)
                   ((long)puVar73 - ((ulong)bVar78 + 2 << ((byte)uVar71 & 0x3f)) >> (bVar32 & 0x3f))
          ;
        }
        local_e8->dist_extra_ = uVar28;
        if ((Hasher *)0x5 < local_100) {
          if (local_100 < (Hasher *)0x82) {
            puVar45 = (undefined1 *)((long)&(&local_100[-1].privat._H2)[0x41].buckets_ + 6);
            uVar49 = 0x1f;
            uVar71 = (uint)puVar45;
            if (uVar71 != 0) {
              for (; uVar71 >> uVar49 == 0; uVar49 = uVar49 - 1) {
              }
            }
            uVar49 = (int)((ulong)puVar45 >> ((char)(uVar49 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar49 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (local_100 < (Hasher *)0x842) {
            uVar71 = 0x1f;
            if (uVar49 - 0x42 != 0) {
              for (; uVar49 - 0x42 >> uVar71 == 0; uVar71 = uVar71 - 1) {
              }
            }
            uVar49 = (uVar71 ^ 0xffe0) + 0x2a;
          }
          else {
            uVar49 = 0x15;
            if ((Hasher *)0x1841 < local_100) {
              uVar49 = (uint)(ushort)(0x17 - (local_100 < (Hasher *)0x5842));
            }
          }
        }
        uVar71 = local_14c + (uint)local_110;
        if (uVar71 < 10) {
          uVar60 = uVar71 - 2;
        }
        else if (uVar71 < 0x86) {
          uVar71 = uVar71 - 6;
          uVar60 = 0x1f;
          if (uVar71 != 0) {
            for (; uVar71 >> uVar60 == 0; uVar60 = uVar60 - 1) {
            }
          }
          uVar60 = (int)((ulong)(long)(int)uVar71 >> ((char)(uVar60 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar60 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar60 = 0x17;
          if (uVar71 < 0x846) {
            uVar60 = 0x1f;
            if (uVar71 - 0x46 != 0) {
              for (; uVar71 - 0x46 >> uVar60 == 0; uVar60 = uVar60 - 1) {
              }
            }
            uVar60 = (uVar60 ^ 0xffe0) + 0x2c;
          }
        }
        uVar7 = (ushort)uVar60;
        uVar59 = (uVar7 & 7) + ((ushort)uVar49 & 7) * 8;
        if ((((local_e8->dist_prefix_ & 0x3ff) == 0) && ((ushort)uVar49 < 8)) && (uVar7 < 0x10)) {
          if (7 < uVar7) {
            uVar59 = uVar59 + 0x40;
          }
        }
        else {
          iVar50 = ((uVar49 & 0xffff) >> 3) * 3 + ((uVar60 & 0xffff) >> 3);
          uVar59 = uVar59 + ((ushort)(0x520d40 >> ((char)iVar50 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar50 * 0x40 + 0x40;
        }
        local_e8->cmd_prefix_ = uVar59;
        *num_literals = (size_t)((long)(local_100->common).extra + *num_literals);
        position = (long)(local_168->common).extra + (long)(local_110->common).extra;
        pHVar43 = pHVar29;
        if (position < pHVar29) {
          pHVar43 = (Hasher *)position;
        }
        pHVar36 = (Hasher *)((long)(local_168->common).extra + 2);
        if (local_170 < (Hasher *)((ulong)local_110 >> 2)) {
          pHVar68 = (Hasher *)(position + (long)local_170 * -4);
          if (pHVar68 < pHVar36) {
            pHVar68 = pHVar36;
          }
          pHVar36 = pHVar68;
          if (pHVar43 < pHVar68) {
            pHVar36 = pHVar43;
          }
        }
        pHVar68 = (Hasher *)((long)(local_168->common).extra + lVar35 + (long)local_110 * 2);
        local_e8 = local_e8 + 1;
        if (pHVar36 < pHVar43) {
          uVar19 = (hasher->privat)._H6.hash_mul_;
          uVar49 = (hasher->privat)._H6.block_mask_;
          uVar10 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
          do {
            uVar37 = *(long *)(ringbuffer + ((ulong)pHVar36 & ringbuffer_mask)) * uVar19 >> 0x31;
            uVar7 = *(ushort *)((long)puVar13 + uVar37 * 2);
            *(ushort *)((long)puVar13 + uVar37 * 2) = uVar7 + 1;
            puVar14[(uVar37 << ((byte)uVar10 & 0x3f)) + (ulong)(uVar49 & uVar7)] = (uint32_t)pHVar36
            ;
            pHVar36 = (Hasher *)((long)(pHVar36->common).extra + 1);
          } while (pHVar43 != pHVar36);
          local_100 = (Hasher *)0x0;
          unaff_R14 = (Hasher *)ringbuffer;
        }
        else {
          local_100 = (Hasher *)0x0;
        }
      }
      local_168 = (Hasher *)position;
    } while ((((Hasher *)position)->common).extra + 1 < puVar2);
  }
  else {
    local_e8 = commands;
  }
  *last_insert_len = (size_t)(puVar2 + ((long)&local_100->common - position));
  *num_commands = *num_commands + ((long)local_e8 - (long)commands >> 4);
  return;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}